

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_qcc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  int local_38;
  byte local_31;
  int len;
  uint_fast8_t tmp;
  jpc_qcc_t *qcc;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  _len = &ms->parms;
  local_38 = (int)ms->len;
  qcc = (jpc_qcc_t *)in;
  in_local = (jas_stream_t *)cstate;
  cstate_local = (jpc_cstate_t *)ms;
  if (cstate->numcomps < 0x101) {
    iVar1 = jpc_getuint8(in,&local_31);
    if (iVar1 != 0) {
      return -1;
    }
    *(ulong *)_len = (ulong)local_31;
    local_38 = local_38 + -1;
  }
  else {
    iVar1 = jpc_getuint16(in,(uint_fast16_t *)&_len->soc);
    if (iVar1 != 0) {
      return -1;
    }
    local_38 = local_38 + -2;
  }
  iVar1 = jpc_qcx_getcompparms
                    ((jpc_qcxcp_t *)&(_len->qcd).compparms.stepsizes,(jpc_cstate_t *)in_local,
                     (jas_stream_t *)qcc,(long)local_38);
  if (iVar1 == 0) {
    if (((undefined1  [24])qcc->compparms & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      ms_local._4_4_ = 0;
    }
    else {
      jpc_qcc_destroyparms((jpc_ms_t *)cstate_local);
      ms_local._4_4_ = -1;
    }
  }
  else {
    ms_local._4_4_ = -1;
  }
  return ms_local._4_4_;
}

Assistant:

static int jpc_qcc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	uint_fast8_t tmp;
	int len;
	len = ms->len;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		qcc->compno = tmp;
		--len;
	} else {
		if (jpc_getuint16(in, &qcc->compno)) {
			return -1;
		}
		len -= 2;
	}
	if (jpc_qcx_getcompparms(&qcc->compparms, cstate, in, len)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		jpc_qcc_destroyparms(ms);
		return -1;
	}
	return 0;
}